

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::setBasis
          (SPxSolverBase<double> *this,VarStatus *p_rows,VarStatus *p_cols)

{
  SPxStatus SVar1;
  int iVar2;
  Status SVar3;
  Status *pSVar4;
  SPxSolverBase<double> *in_RDI;
  int i;
  Desc ds;
  int in_stack_ffffffffffffff6c;
  Status in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar5;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Desc *in_stack_ffffffffffffff90;
  int local_5c;
  undefined1 local_58 [32];
  VarStatus in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  SPxSolverBase<double> *in_stack_ffffffffffffffd0;
  
  SVar1 = SPxBasisBase<double>::status(&in_RDI->super_SPxBasisBase<double>);
  if (SVar1 == NO_PROBLEM) {
    SPxBasisBase<double>::load
              ((SPxBasisBase<double> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
               ,(SPxSolverBase<double> *)
                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               SUB41((uint)in_stack_ffffffffffffff74 >> 0x18,0));
  }
  SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
  SPxBasisBase<double>::Desc::Desc(in_stack_ffffffffffffff90,(Desc *)in_RDI);
  local_5c = 0;
  while( true ) {
    iVar5 = local_5c;
    iVar2 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x45a68b);
    if (iVar2 <= iVar5) break;
    SVar3 = varStatusToBasisStatusRow
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                      );
    pSVar4 = SPxBasisBase<double>::Desc::rowStatus
                       ((Desc *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c);
    *pSVar4 = SVar3;
    local_5c = local_5c + 1;
  }
  local_5c = 0;
  while( true ) {
    iVar5 = local_5c;
    iVar2 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x45a717);
    if (iVar2 <= iVar5) break;
    in_stack_ffffffffffffff70 =
         varStatusToBasisStatusCol
                   (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    pSVar4 = SPxBasisBase<double>::Desc::colStatus
                       ((Desc *)CONCAT44(iVar5,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c)
    ;
    *pSVar4 = in_stack_ffffffffffffff70;
    local_5c = local_5c + 1;
  }
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x58])(in_RDI,local_58);
  forceRecompNonbasicValue(in_RDI);
  SPxBasisBase<double>::Desc::~Desc((Desc *)CONCAT44(iVar5,in_stack_ffffffffffffff70));
  return;
}

Assistant:

void SPxSolverBase<R>::setBasis(const VarStatus p_rows[], const VarStatus p_cols[])
   {
      if(SPxBasisBase<R>::status() == SPxBasisBase<R>::NO_PROBLEM)
         SPxBasisBase<R>::load(this, false);

      typename SPxBasisBase<R>::Desc ds = this->desc();
      int i;

      for(i = 0; i < this->nRows(); i++)
         ds.rowStatus(i) = varStatusToBasisStatusRow(i, p_rows[i]);

      for(i = 0; i < this->nCols(); i++)
         ds.colStatus(i) = varStatusToBasisStatusCol(i, p_cols[i]);

      loadBasis(ds);
      forceRecompNonbasicValue();
   }